

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

DThinker * __thiscall
FDecalSliderAnim::CreateThinker(FDecalSliderAnim *this,DBaseDecal *actor,side_t *wall)

{
  DDecalSlider *this_00;
  DDecalSlider *thinker;
  side_t *wall_local;
  DBaseDecal *actor_local;
  FDecalSliderAnim *this_local;
  
  this_00 = (DDecalSlider *)DObject::operator_new((DObject *)0x68,(size_t)actor);
  DDecalSlider::DDecalSlider(this_00,actor);
  this_00->TimeToStart = ::level.maptime + *(int *)&(this->super_FDecalAnimator).field_0xc;
  this_00->TimeToStop = this_00->TimeToStart + this->SlideTime;
  this_00->DistY = this->DistY;
  this_00->bStarted = false;
  return (DThinker *)this_00;
}

Assistant:

DThinker *FDecalSliderAnim::CreateThinker (DBaseDecal *actor, side_t *wall) const
{
	DDecalSlider *thinker = new DDecalSlider (actor);

	thinker->TimeToStart = level.maptime + SlideStart;
	thinker->TimeToStop = thinker->TimeToStart + SlideTime;
	/*thinker->DistX = DistX;*/
	thinker->DistY = DistY;
	thinker->bStarted = false;
	return thinker;
}